

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O0

void BrotliCreateHqZopfliBackwardReferences
               (MemoryManager *m,size_t num_bytes,size_t position,uint8_t *ringbuffer,
               size_t ringbuffer_mask,BrotliEncoderParams *params,HasherHandle hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  uint uVar1;
  size_t sVar2;
  size_t last_insert_len_00;
  undefined8 uVar3;
  undefined8 uVar4;
  BackwardMatch *pBVar5;
  int iVar6;
  ulong max_backward_limit_00;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  size_t sVar12;
  ZopfliNode *local_1528;
  size_t local_1518;
  size_t local_1500;
  ulong local_14f0;
  uint local_14c8;
  ulong local_14b8;
  size_t local_14b0;
  size_t local_14a0;
  ulong local_1498;
  void *local_1488;
  BackwardMatch *local_1480;
  ulong local_1478;
  void *local_1470;
  ulong local_1468;
  uint32_t *local_1460;
  size_t skip;
  size_t match_len;
  BackwardMatch *new_array;
  size_t _new_size;
  size_t j;
  size_t cur_match_end;
  size_t num_found_matches;
  size_t max_length;
  size_t max_distance;
  size_t pos;
  size_t shadow_matches;
  size_t gap;
  BackwardMatch *matches;
  ZopfliNode *nodes;
  ZopfliCostModel model;
  size_t orig_num_commands;
  int orig_dist_cache [4];
  size_t orig_last_insert_len;
  size_t orig_num_literals;
  size_t i;
  size_t cur_match_pos;
  size_t store_end;
  size_t matches_size;
  uint32_t *num_matches;
  size_t max_backward_limit;
  BrotliEncoderParams *params_local;
  size_t ringbuffer_mask_local;
  uint8_t *ringbuffer_local;
  size_t position_local;
  size_t num_bytes_local;
  MemoryManager *m_local;
  size_t distance;
  ulong uStack_800;
  uint32_t dict_id;
  size_t l;
  size_t maxlen;
  size_t minlen;
  size_t len;
  size_t backward;
  size_t prev_ix;
  size_t i_1;
  uint32_t dict_matches [38];
  size_t stop;
  size_t short_match_max_backward;
  size_t best_len;
  size_t cur_ix_masked;
  BackwardMatch *orig_matches;
  BrotliEncoderParams *local_700;
  long local_6f8;
  ulong local_6f0;
  ulong local_6e8;
  ulong local_6e0;
  size_t local_6d8;
  uint8_t *local_6d0;
  BrotliEncoderDictionary *local_6c8;
  HasherHandle local_6c0;
  ulong local_6b8;
  undefined8 local_6b0;
  long local_6a8;
  ulong local_6a0;
  undefined8 local_698;
  H10 *local_690;
  size_t j_1;
  size_t i_2;
  H10 *local_678;
  ulong local_670;
  uint8_t *local_668;
  HasherHandle local_660;
  ulong local_658;
  size_t matching_bits;
  uint64_t x;
  size_t limit2;
  size_t matched;
  ulong *local_630;
  uint8_t *local_628;
  size_t local_620;
  ulong local_618;
  ulong local_610;
  BackwardMatch *local_608;
  ulong local_600;
  size_t len_1;
  size_t cur_len;
  size_t prev_ix_masked;
  size_t backward_1;
  size_t depth_remaining;
  size_t best_len_right;
  size_t best_len_left;
  size_t node_right;
  size_t node_left;
  size_t prev_ix_1;
  uint32_t *forest;
  uint32_t key;
  int should_reroot_tree;
  size_t max_comp_len;
  size_t cur_ix_masked_1;
  ulong *local_588;
  ulong local_580;
  ulong local_578;
  size_t local_570;
  ulong local_568;
  uint8_t *local_560;
  ulong *local_558;
  size_t local_550;
  size_t local_548;
  undefined8 local_540;
  ulong local_538;
  ulong local_530;
  size_t matching_bits_1;
  uint64_t x_1;
  size_t limit2_1;
  size_t matched_1;
  ulong *local_508;
  uint8_t *local_500;
  size_t local_4f8;
  ulong local_4f0;
  size_t local_4e8;
  size_t local_4e0;
  HasherHandle local_4d8;
  ulong local_4d0;
  ulong local_4c8;
  ulong local_4c0;
  BackwardMatch *local_4b8;
  ulong *local_4b0;
  ulong *local_4a8;
  ulong *local_4a0;
  ulong *local_498;
  ulong *local_490;
  ulong *local_488;
  ulong *local_480;
  ulong *local_478;
  ulong *local_470;
  size_t local_468;
  ulong *local_460;
  size_t local_458;
  ulong *local_450;
  ulong local_448;
  ulong *local_440;
  size_t local_438;
  ulong *local_430;
  size_t local_428;
  ulong *local_420;
  ulong local_418;
  ulong *local_410;
  HasherHandle local_408;
  ulong local_400;
  size_t max_backward;
  H10 *self;
  ulong local_3e8;
  uint8_t *local_3e0;
  HasherHandle local_3d8;
  ulong local_3d0;
  size_t len_2;
  size_t cur_len_1;
  size_t prev_ix_masked_1;
  size_t backward_2;
  size_t depth_remaining_1;
  size_t best_len_right_1;
  size_t best_len_left_1;
  size_t node_right_1;
  size_t node_left_1;
  size_t prev_ix_2;
  uint32_t *forest_1;
  uint32_t key_1;
  int should_reroot_tree_1;
  size_t max_comp_len_1;
  size_t cur_ix_masked_2;
  ulong *local_358;
  ulong local_350;
  long local_348;
  ulong local_340;
  H10 *local_338;
  uint8_t *local_330;
  ulong *local_328;
  size_t local_320;
  size_t local_318;
  undefined8 local_310;
  undefined8 local_308;
  ulong local_300;
  size_t matching_bits_2;
  uint64_t x_2;
  size_t limit2_2;
  size_t matched_2;
  ulong *local_2d8;
  uint8_t *local_2d0;
  size_t local_2c8;
  ulong local_2c0;
  ulong local_2b8;
  size_t local_2b0;
  HasherHandle local_2a8;
  ulong *local_2a0;
  ulong *local_298;
  ulong *local_290;
  ulong *local_288;
  ulong *local_280;
  size_t local_278;
  ulong *local_270;
  size_t local_268;
  ulong *local_260;
  H10 *local_258;
  ulong *local_250;
  size_t local_248;
  ulong *local_240;
  size_t local_238;
  ulong *local_230;
  H10 *local_228;
  ulong *local_220;
  HasherHandle local_218;
  ulong local_210;
  size_t max_backward_1;
  H10 *self_1;
  ulong local_1f8;
  uint8_t *local_1f0;
  HasherHandle local_1e8;
  ulong local_1e0;
  size_t len_3;
  size_t cur_len_2;
  size_t prev_ix_masked_2;
  size_t backward_3;
  size_t depth_remaining_2;
  size_t best_len_right_2;
  size_t best_len_left_2;
  size_t node_right_2;
  size_t node_left_2;
  size_t prev_ix_3;
  uint32_t *forest_2;
  uint32_t key_2;
  int should_reroot_tree_2;
  size_t max_comp_len_2;
  size_t cur_ix_masked_3;
  ulong *local_168;
  ulong local_160;
  long local_158;
  ulong local_150;
  size_t local_148;
  uint8_t *local_140;
  ulong *local_138;
  size_t local_130;
  size_t local_128;
  undefined8 local_120;
  undefined8 local_118;
  ulong local_110;
  size_t matching_bits_3;
  uint64_t x_3;
  size_t limit2_3;
  size_t matched_3;
  ulong *local_e8;
  uint8_t *local_e0;
  size_t local_d8;
  ulong local_d0;
  ulong local_c8;
  size_t local_c0;
  HasherHandle local_b8;
  ulong *local_b0;
  ulong *local_a8;
  ulong *local_a0;
  ulong *local_98;
  ulong *local_90;
  size_t local_88;
  ulong *local_80;
  size_t local_78;
  ulong *local_70;
  ulong local_68;
  ulong *local_60;
  size_t local_58;
  ulong *local_50;
  size_t local_48;
  ulong *local_40;
  ulong local_38;
  ulong *local_30;
  HasherHandle local_28;
  
  max_backward_limit_00 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  if (num_bytes == 0) {
    local_1460 = (uint32_t *)0x0;
  }
  else {
    local_1460 = (uint32_t *)BrotliAllocate(m,num_bytes << 2);
  }
  store_end = num_bytes << 2;
  local_1468 = position;
  if (0x7f < num_bytes) {
    local_1468 = (position + num_bytes) - 0x7f;
  }
  i = 0;
  if (store_end == 0) {
    local_1470 = (void *)0x0;
  }
  else {
    local_1470 = BrotliAllocate(m,num_bytes << 5);
  }
  gap = (size_t)local_1470;
  orig_num_literals = 0;
  do {
    if (num_bytes <= orig_num_literals + 3) {
      sVar2 = *num_literals;
      last_insert_len_00 = *last_insert_len;
      uVar3 = *(undefined8 *)dist_cache;
      uVar4 = *(undefined8 *)(dist_cache + 2);
      model.num_bytes_ = *num_commands;
      if (num_bytes == 0xffffffffffffffff) {
        local_1528 = (ZopfliNode *)0x0;
      }
      else {
        local_1528 = (ZopfliNode *)BrotliAllocate(m,(num_bytes + 1) * 0x10);
      }
      InitZopfliCostModel(m,(ZopfliCostModel *)&nodes,&params->dist,num_bytes);
      for (orig_num_literals = 0; orig_num_literals < 2; orig_num_literals = orig_num_literals + 1)
      {
        BrotliInitZopfliNodes(local_1528,num_bytes + 1);
        if (orig_num_literals == 0) {
          ZopfliCostModelSetFromLiteralCosts
                    ((ZopfliCostModel *)&nodes,position,ringbuffer,ringbuffer_mask);
        }
        else {
          ZopfliCostModelSetFromCommands
                    ((ZopfliCostModel *)&nodes,position,ringbuffer,ringbuffer_mask,commands,
                     *num_commands - model.num_bytes_,last_insert_len_00);
        }
        *num_commands = model.num_bytes_;
        *num_literals = sVar2;
        *last_insert_len = last_insert_len_00;
        *(undefined8 *)dist_cache = uVar3;
        *(undefined8 *)(dist_cache + 2) = uVar4;
        sVar12 = ZopfliIterate(num_bytes,position,ringbuffer,ringbuffer_mask,params,
                               max_backward_limit_00,0,dist_cache,(ZopfliCostModel *)&nodes,
                               local_1460,(BackwardMatch *)gap,local_1528);
        *num_commands = sVar12 + *num_commands;
        BrotliZopfliCreateCommands
                  (num_bytes,position,max_backward_limit_00,local_1528,dist_cache,last_insert_len,
                   params,commands,num_literals);
      }
      CleanupZopfliCostModel(m,(ZopfliCostModel *)&nodes);
      BrotliFree(m,local_1528);
      BrotliFree(m,(void *)gap);
      BrotliFree(m,local_1460);
      return;
    }
    uVar7 = position + orig_num_literals;
    local_1478 = max_backward_limit_00;
    if (uVar7 < max_backward_limit_00) {
      local_1478 = uVar7;
    }
    uVar8 = num_bytes - orig_num_literals;
    if (store_end < i + 0x80) {
      if (store_end == 0) {
        local_1480 = (BackwardMatch *)(i + 0x80);
      }
      else {
        local_1480 = (BackwardMatch *)store_end;
      }
      for (new_array = local_1480; new_array < (BackwardMatch *)(i + 0x80);
          new_array = (BackwardMatch *)((long)new_array << 1)) {
      }
      if (new_array == (BackwardMatch *)0x0) {
        local_1488 = (void *)0x0;
      }
      else {
        local_1488 = BrotliAllocate(m,(long)new_array << 3);
      }
      if (store_end != 0) {
        memcpy(local_1488,(void *)gap,store_end << 3);
      }
      BrotliFree(m,(void *)gap);
      gap = (size_t)local_1488;
      store_end = (size_t)new_array;
    }
    local_6c8 = &params->dictionary;
    cur_ix_masked = gap + i * 8;
    local_6c0 = hasher;
    local_6f0 = local_1478;
    local_6f8 = 0;
    best_len = uVar7 & ringbuffer_mask;
    short_match_max_backward = 1;
    iVar6 = 0x40;
    if (params->quality != 0xb) {
      iVar6 = 0x10;
    }
    dict_matches._144_8_ = uVar7 - (long)iVar6;
    orig_matches = (BackwardMatch *)cur_ix_masked;
    prev_ix = uVar7;
    if (uVar7 < (ulong)(long)iVar6) {
      dict_matches[0x24] = 0;
      dict_matches[0x25] = 0;
      orig_matches = (BackwardMatch *)cur_ix_masked;
    }
    while ((prev_ix = prev_ix - 1,
           (ulong)dict_matches._144_8_ < prev_ix && short_match_max_backward < 3 &&
           (uVar9 = uVar7 - prev_ix, uVar9 <= local_1478))) {
      uVar10 = ringbuffer_mask & prev_ix;
      if ((ringbuffer[best_len] == ringbuffer[uVar10]) &&
         (ringbuffer[best_len + 1] == ringbuffer[uVar10 + 1])) {
        local_628 = ringbuffer + uVar10;
        local_630 = (ulong *)(ringbuffer + best_len);
        limit2 = 0;
        x = (uVar8 >> 3) + 1;
LAB_0012412f:
        x = x - 1;
        if (x != 0) {
          local_478 = local_630;
          local_480 = (ulong *)(local_628 + limit2);
          if (*local_630 == *local_480) goto LAB_00124191;
          local_488 = local_630;
          local_490 = (ulong *)(local_628 + limit2);
          iVar6 = 0;
          matching_bits = *local_630 ^ *local_490;
          for (uVar10 = matching_bits; (uVar10 & 1) == 0; uVar10 = uVar10 >> 1 | 0x8000000000000000)
          {
            iVar6 = iVar6 + 1;
          }
          local_658 = (ulong)iVar6;
          local_620 = (local_658 >> 3) + limit2;
          matched = uVar8;
          goto LAB_001242d2;
        }
        matched = (uVar8 & 7) + 1;
        while (matched = matched - 1, matched != 0) {
          if (local_628[limit2] != (uint8_t)*local_630) {
            local_620 = limit2;
            goto LAB_001242d2;
          }
          local_630 = (ulong *)((long)local_630 + 1);
          limit2 = limit2 + 1;
        }
        local_620 = limit2;
LAB_001242d2:
        limit2 = local_620;
        if (short_match_max_backward < local_620) {
          short_match_max_backward = local_620;
          local_608 = orig_matches;
          local_618 = local_620;
          orig_matches->distance = (uint32_t)uVar9;
          orig_matches->length_and_code = (uint32_t)(local_620 << 5);
          orig_matches = orig_matches + 1;
          local_610 = uVar9;
        }
      }
    }
    local_700 = params;
    local_6e8 = uVar8;
    local_6e0 = uVar7;
    local_6d8 = ringbuffer_mask;
    local_6d0 = ringbuffer;
    if (short_match_max_backward < uVar8) {
      local_4d8 = hasher;
      local_408 = hasher;
      local_558 = (ulong *)(hasher + 0x28);
      local_580 = local_1478;
      local_588 = &short_match_max_backward;
      cur_ix_masked_1 = (size_t)orig_matches;
      max_comp_len = uVar7 & ringbuffer_mask;
      local_540 = 0x80;
      local_1498 = uVar8;
      if (0x7f < uVar8) {
        local_1498 = 0x80;
      }
      _key = local_1498;
      forest._4_4_ = (uint)(0x7f < uVar8);
      local_578 = uVar8;
      local_570 = ringbuffer_mask;
      local_568 = uVar7;
      local_560 = ringbuffer;
      local_538 = uVar8;
      forest._0_4_ = HashBytesH10(ringbuffer + max_comp_len);
      local_470 = local_558;
      prev_ix_1 = (size_t)(local_558 + 0x10002);
      uVar1 = *(uint *)((long)local_558 + (ulong)(uint32_t)forest * 4 + 8);
      local_440 = local_558;
      local_448 = local_568;
      node_right = (local_568 & *local_558) << 1;
      local_410 = local_558;
      local_418 = local_568;
      best_len_left = (local_568 & *local_558) * 2 + 1;
      best_len_right = 0;
      depth_remaining = 0;
      if (forest._4_4_ != 0) {
        *(int *)((long)local_558 + (ulong)(uint32_t)forest * 4 + 8) = (int)local_568;
      }
      backward_1 = 0x40;
      while( true ) {
        node_left = (size_t)uVar1;
        prev_ix_masked = local_568 - node_left;
        cur_len = node_left & local_570;
        if (((prev_ix_masked == 0) || (local_580 < prev_ix_masked)) || (backward_1 == 0)) break;
        local_548 = best_len_right;
        local_550 = depth_remaining;
        if (best_len_right < depth_remaining) {
          local_14a0 = best_len_right;
        }
        else {
          local_14a0 = depth_remaining;
        }
        len_1 = local_14a0;
        local_500 = local_560 + max_comp_len + local_14a0;
        local_508 = (ulong *)(local_560 + cur_len + local_14a0);
        matched_1 = local_578 - local_14a0;
        limit2_1 = 0;
        x_1 = (matched_1 >> 3) + 1;
LAB_0012471f:
        x_1 = x_1 - 1;
        if (x_1 != 0) {
          local_498 = local_508;
          local_4a0 = (ulong *)(local_500 + limit2_1);
          if (*local_508 == *local_4a0) goto LAB_00124781;
          local_4a8 = local_508;
          local_4b0 = (ulong *)(local_500 + limit2_1);
          iVar6 = 0;
          matching_bits_1 = *local_508 ^ *local_4b0;
          for (uVar8 = matching_bits_1; (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x8000000000000000) {
            iVar6 = iVar6 + 1;
          }
          local_530 = (ulong)iVar6;
          local_4f8 = (local_530 >> 3) + limit2_1;
          goto LAB_001248c2;
        }
        matched_1 = (matched_1 & 7) + 1;
        while (matched_1 = matched_1 - 1, matched_1 != 0) {
          if (local_500[limit2_1] != (uint8_t)*local_508) {
            local_4f8 = limit2_1;
            goto LAB_001248c2;
          }
          local_508 = (ulong *)((long)local_508 + 1);
          limit2_1 = limit2_1 + 1;
        }
        local_4f8 = limit2_1;
LAB_001248c2:
        local_600 = local_14a0 + local_4f8;
        limit2_1 = local_4f8;
        if ((cur_ix_masked_1 != 0) && (*local_588 < local_600)) {
          *local_588 = local_600;
          local_4e0 = cur_ix_masked_1;
          local_4e8 = prev_ix_masked;
          local_4f0 = local_600;
          *(int *)cur_ix_masked_1 = (int)prev_ix_masked;
          *(int *)(cur_ix_masked_1 + 4) = (int)(local_600 << 5);
          cur_ix_masked_1 = cur_ix_masked_1 + 8;
        }
        if (_key <= local_600) {
          if (forest._4_4_ != 0) {
            local_460 = local_558;
            local_468 = node_left;
            *(undefined4 *)(prev_ix_1 + node_right * 4) =
                 *(undefined4 *)(prev_ix_1 + (node_left & *local_558) * 8);
            local_430 = local_558;
            local_438 = node_left;
            *(undefined4 *)(prev_ix_1 + best_len_left * 4) =
                 *(undefined4 *)(prev_ix_1 + 4 + (node_left & *local_558) * 8);
          }
          goto LAB_00124b81;
        }
        if (local_560[cur_len + local_600] < local_560[max_comp_len + local_600]) {
          best_len_right = local_600;
          if (forest._4_4_ != 0) {
            *(int *)(prev_ix_1 + node_right * 4) = (int)node_left;
          }
          local_420 = local_558;
          local_428 = node_left;
          node_right = (node_left & *local_558) * 2 + 1;
          uVar1 = *(uint *)(prev_ix_1 + node_right * 4);
        }
        else {
          depth_remaining = local_600;
          if (forest._4_4_ != 0) {
            *(int *)(prev_ix_1 + best_len_left * 4) = (int)node_left;
          }
          local_450 = local_558;
          local_458 = node_left;
          best_len_left = (node_left & *local_558) * 2;
          uVar1 = *(uint *)(prev_ix_1 + (node_left & *local_558) * 8);
        }
        backward_1 = backward_1 - 1;
      }
      if (forest._4_4_ != 0) {
        *(int *)(prev_ix_1 + node_right * 4) = (int)local_558[0x10001];
        *(int *)(prev_ix_1 + best_len_left * 4) = (int)local_558[0x10001];
      }
LAB_00124b81:
      orig_matches = (BackwardMatch *)cur_ix_masked_1;
    }
    for (prev_ix = 0; prev_ix < 0x26; prev_ix = prev_ix + 1) {
      dict_matches[prev_ix - 2] = 0xfffffff;
    }
    local_6a0 = short_match_max_backward + 1;
    local_698 = 4;
    local_14b0 = local_6a0;
    if (local_6a0 < 4) {
      local_14b0 = 4;
    }
    iVar6 = BrotliFindAllStaticDictionaryMatches
                      (local_6c8,local_6d0 + best_len,local_14b0,local_6e8,(uint32_t *)&i_1);
    if (iVar6 != 0) {
      local_6b0 = 0x25;
      local_6b8 = local_6e8;
      if (local_6e8 < 0x26) {
        local_14b8 = local_6e8;
      }
      else {
        local_14b8 = 0x25;
      }
      for (uStack_800 = local_14b0; pBVar5 = orig_matches, uStack_800 <= local_14b8;
          uStack_800 = uStack_800 + 1) {
        local_14c8 = dict_matches[uStack_800 - 2];
        if ((local_14c8 < 0xfffffff) &&
           (uVar8 = local_6f0 + local_6f8 + (ulong)(local_14c8 >> 5) + 1,
           uVar8 <= (local_700->dist).max_distance)) {
          orig_matches = orig_matches + 1;
          local_14c8 = local_14c8 & 0x1f;
          local_4b8 = pBVar5;
          local_4c0 = uVar8;
          local_4c8 = uStack_800;
          local_4d0 = (ulong)local_14c8;
          pBVar5->distance = (uint32_t)uVar8;
          if (uStack_800 == local_14c8) {
            local_14c8 = 0;
          }
          pBVar5->length_and_code = (uint)(uStack_800 << 5) | local_14c8;
        }
      }
    }
    lVar11 = (long)((long)orig_matches - cur_ix_masked) >> 3;
    uVar8 = i + lVar11;
    for (_new_size = i; _new_size + 1 < uVar8; _new_size = _new_size + 1) {
    }
    local_1460[orig_num_literals] = (uint32_t)lVar11;
    sVar2 = i;
    if (lVar11 != 0) {
      local_6a8 = gap + (uVar8 - 1) * 8;
      uVar9 = (ulong)(*(uint *)(local_6a8 + 4) >> 5);
      sVar2 = uVar8;
      if (0x145 < uVar9) {
        *(undefined8 *)(gap + i * 8) = *(undefined8 *)(gap + (uVar8 - 1) * 8);
        local_1460[orig_num_literals] = 1;
        local_690 = (H10 *)(uVar7 + 1);
        local_14f0 = uVar7 + uVar9;
        if (local_1468 <= local_14f0) {
          local_14f0 = local_1468;
        }
        local_660 = hasher;
        i_2 = local_14f0;
        j_1 = (size_t)local_690;
        if (uVar7 + 0x40 <= local_14f0) {
          j_1 = local_14f0 - 0x3f;
        }
        local_678 = local_690;
        local_670 = ringbuffer_mask;
        local_668 = ringbuffer;
        if (uVar7 + 0x201 <= j_1) {
          for (; local_690 < j_1; local_690 = (H10 *)local_690->buckets_) {
            local_3d8 = local_660;
            local_3e0 = local_668;
            local_3e8 = local_670;
            self = local_690;
            local_2a8 = local_660;
            local_218 = local_660;
            max_backward = (size_t)(local_660 + 0x28);
            local_400 = *(ulong *)max_backward - 0xf;
            local_330 = local_668;
            local_338 = local_690;
            local_340 = local_670;
            local_348 = 0x80;
            local_358 = (ulong *)0x0;
            cur_ix_masked_2 = 0;
            max_comp_len_1 = (ulong)local_690 & local_670;
            local_308 = 0x80;
            local_310 = 0x80;
            _key_1 = 0x80;
            forest_1._4_4_ = 1;
            local_350 = local_400;
            local_328 = (ulong *)max_backward;
            forest_1._0_4_ = HashBytesH10(local_668 + max_comp_len_1);
            local_280 = local_328;
            prev_ix_2 = (size_t)(local_328 + 0x10002);
            uVar1 = *(uint *)((long)local_328 + (ulong)(uint32_t)forest_1 * 4 + 8);
            local_250 = local_328;
            local_258 = local_338;
            node_right_1 = ((ulong)local_338 & *local_328) << 1;
            local_220 = local_328;
            local_228 = local_338;
            best_len_left_1 = ((ulong)local_338 & *local_328) * 2 + 1;
            best_len_right_1 = 0;
            depth_remaining_1 = 0;
            if (forest_1._4_4_ != 0) {
              *(int *)((long)local_328 + (ulong)(uint32_t)forest_1 * 4 + 8) = (int)local_338;
            }
            backward_2 = 0x40;
            while( true ) {
              node_left_1 = (size_t)uVar1;
              prev_ix_masked_1 = (long)local_338 - node_left_1;
              cur_len_1 = node_left_1 & local_340;
              if (((prev_ix_masked_1 == 0) || (local_350 < prev_ix_masked_1)) || (backward_2 == 0))
              break;
              local_318 = best_len_right_1;
              local_320 = depth_remaining_1;
              if (best_len_right_1 < depth_remaining_1) {
                local_1500 = best_len_right_1;
              }
              else {
                local_1500 = depth_remaining_1;
              }
              len_2 = local_1500;
              local_2d0 = local_330 + max_comp_len_1 + local_1500;
              local_2d8 = (ulong *)(local_330 + cur_len_1 + local_1500);
              matched_2 = local_348 - local_1500;
              limit2_2 = 0;
              x_2 = (matched_2 >> 3) + 1;
LAB_00125464:
              x_2 = x_2 - 1;
              if (x_2 != 0) {
                local_288 = local_2d8;
                local_290 = (ulong *)(local_2d0 + limit2_2);
                if (*local_2d8 == *local_290) goto LAB_001254c6;
                local_298 = local_2d8;
                local_2a0 = (ulong *)(local_2d0 + limit2_2);
                iVar6 = 0;
                matching_bits_2 = *local_2d8 ^ *local_2a0;
                for (uVar7 = matching_bits_2; (uVar7 & 1) == 0;
                    uVar7 = uVar7 >> 1 | 0x8000000000000000) {
                  iVar6 = iVar6 + 1;
                }
                local_300 = (ulong)iVar6;
                local_2c8 = (local_300 >> 3) + limit2_2;
                goto LAB_00125607;
              }
              matched_2 = (matched_2 & 7) + 1;
              while (matched_2 = matched_2 - 1, matched_2 != 0) {
                if (local_2d0[limit2_2] != (uint8_t)*local_2d8) {
                  local_2c8 = limit2_2;
                  goto LAB_00125607;
                }
                local_2d8 = (ulong *)((long)local_2d8 + 1);
                limit2_2 = limit2_2 + 1;
              }
              local_2c8 = limit2_2;
LAB_00125607:
              local_3d0 = local_1500 + local_2c8;
              if ((cur_ix_masked_2 != 0) && (*local_358 < local_3d0)) {
                *local_358 = local_3d0;
                local_2b0 = cur_ix_masked_2;
                *(int *)cur_ix_masked_2 = (int)prev_ix_masked_1;
                *(int *)(cur_ix_masked_2 + 4) = (int)local_3d0 * 0x20;
                cur_ix_masked_2 = cur_ix_masked_2 + 8;
                local_2c0 = local_3d0;
                local_2b8 = prev_ix_masked_1;
              }
              limit2_2 = local_2c8;
              if (_key_1 <= local_3d0) {
                if (forest_1._4_4_ != 0) {
                  local_270 = local_328;
                  local_278 = node_left_1;
                  *(int *)(prev_ix_2 + node_right_1 * 4) =
                       (int)*(ulong *)(prev_ix_2 + (node_left_1 & *local_328) * 8);
                  local_240 = local_328;
                  local_248 = node_left_1;
                  *(undefined4 *)(prev_ix_2 + best_len_left_1 * 4) =
                       *(undefined4 *)((long)local_328 + (node_left_1 & *local_328) * 8 + 0x80014);
                }
                goto LAB_001258c6;
              }
              if (local_330[cur_len_1 + local_3d0] < local_330[max_comp_len_1 + local_3d0]) {
                if (forest_1._4_4_ != 0) {
                  *(uint *)(prev_ix_2 + node_right_1 * 4) = uVar1;
                }
                local_230 = local_328;
                local_238 = node_left_1;
                node_right_1 = (node_left_1 & *local_328) * 2 + 1;
                uVar1 = *(uint *)(prev_ix_2 + node_right_1 * 4);
                best_len_right_1 = local_3d0;
              }
              else {
                if (forest_1._4_4_ != 0) {
                  *(uint *)(prev_ix_2 + best_len_left_1 * 4) = uVar1;
                }
                local_260 = local_328;
                local_268 = node_left_1;
                best_len_left_1 = (node_left_1 & *local_328) * 2;
                uVar1 = (uint)*(ulong *)(prev_ix_2 + (node_left_1 & *local_328) * 8);
                depth_remaining_1 = local_3d0;
              }
              backward_2 = backward_2 - 1;
            }
            if (forest_1._4_4_ != 0) {
              *(int *)(prev_ix_2 + node_right_1 * 4) = (int)local_328[0x10001];
              *(int *)(prev_ix_2 + best_len_left_1 * 4) = (int)local_328[0x10001];
            }
LAB_001258c6:
          }
        }
        for (; j_1 < i_2; j_1 = j_1 + 1) {
          local_1e8 = local_660;
          local_1f0 = local_668;
          local_1f8 = local_670;
          self_1 = (H10 *)j_1;
          local_b8 = local_660;
          local_28 = local_660;
          max_backward_1 = (size_t)(local_660 + 0x28);
          local_210 = *(ulong *)max_backward_1 - 0xf;
          local_140 = local_668;
          local_148 = j_1;
          local_150 = local_670;
          local_158 = 0x80;
          local_168 = (ulong *)0x0;
          cur_ix_masked_3 = 0;
          max_comp_len_2 = j_1 & local_670;
          local_118 = 0x80;
          local_120 = 0x80;
          _key_2 = 0x80;
          forest_2._4_4_ = 1;
          local_160 = local_210;
          local_138 = (ulong *)max_backward_1;
          forest_2._0_4_ = HashBytesH10(local_668 + max_comp_len_2);
          local_90 = local_138;
          prev_ix_3 = (size_t)(local_138 + 0x10002);
          uVar1 = *(uint *)((long)local_138 + (ulong)(uint32_t)forest_2 * 4 + 8);
          local_60 = local_138;
          local_68 = local_148;
          node_right_2 = (local_148 & *local_138) << 1;
          local_30 = local_138;
          local_38 = local_148;
          best_len_left_2 = (local_148 & *local_138) * 2 + 1;
          best_len_right_2 = 0;
          depth_remaining_2 = 0;
          if (forest_2._4_4_ != 0) {
            *(int *)((long)local_138 + (ulong)(uint32_t)forest_2 * 4 + 8) = (int)local_148;
          }
          backward_3 = 0x40;
          while( true ) {
            node_left_2 = (size_t)uVar1;
            prev_ix_masked_2 = local_148 - node_left_2;
            cur_len_2 = node_left_2 & local_150;
            if (((prev_ix_masked_2 == 0) || (local_160 < prev_ix_masked_2)) || (backward_3 == 0))
            break;
            local_128 = best_len_right_2;
            local_130 = depth_remaining_2;
            if (best_len_right_2 < depth_remaining_2) {
              local_1518 = best_len_right_2;
            }
            else {
              local_1518 = depth_remaining_2;
            }
            len_3 = local_1518;
            local_e0 = local_140 + max_comp_len_2 + local_1518;
            local_e8 = (ulong *)(local_140 + cur_len_2 + local_1518);
            matched_3 = local_158 - local_1518;
            limit2_3 = 0;
            x_3 = (matched_3 >> 3) + 1;
LAB_00125cc0:
            x_3 = x_3 - 1;
            if (x_3 != 0) {
              local_98 = local_e8;
              local_a0 = (ulong *)(local_e0 + limit2_3);
              if (*local_e8 == *local_a0) goto LAB_00125d22;
              local_a8 = local_e8;
              local_b0 = (ulong *)(local_e0 + limit2_3);
              iVar6 = 0;
              matching_bits_3 = *local_e8 ^ *local_b0;
              for (uVar7 = matching_bits_3; (uVar7 & 1) == 0;
                  uVar7 = uVar7 >> 1 | 0x8000000000000000) {
                iVar6 = iVar6 + 1;
              }
              local_110 = (ulong)iVar6;
              local_d8 = (local_110 >> 3) + limit2_3;
              goto LAB_00125e63;
            }
            matched_3 = (matched_3 & 7) + 1;
            while (matched_3 = matched_3 - 1, matched_3 != 0) {
              if (local_e0[limit2_3] != (uint8_t)*local_e8) {
                local_d8 = limit2_3;
                goto LAB_00125e63;
              }
              local_e8 = (ulong *)((long)local_e8 + 1);
              limit2_3 = limit2_3 + 1;
            }
            local_d8 = limit2_3;
LAB_00125e63:
            local_1e0 = local_1518 + local_d8;
            if ((cur_ix_masked_3 != 0) && (*local_168 < local_1e0)) {
              *local_168 = local_1e0;
              local_c0 = cur_ix_masked_3;
              *(int *)cur_ix_masked_3 = (int)prev_ix_masked_2;
              *(int *)(cur_ix_masked_3 + 4) = (int)local_1e0 * 0x20;
              cur_ix_masked_3 = cur_ix_masked_3 + 8;
              local_d0 = local_1e0;
              local_c8 = prev_ix_masked_2;
            }
            limit2_3 = local_d8;
            if (_key_2 <= local_1e0) {
              if (forest_2._4_4_ != 0) {
                local_80 = local_138;
                local_88 = node_left_2;
                *(int *)(prev_ix_3 + node_right_2 * 4) =
                     (int)*(ulong *)(prev_ix_3 + (node_left_2 & *local_138) * 8);
                local_50 = local_138;
                local_58 = node_left_2;
                *(undefined4 *)(prev_ix_3 + best_len_left_2 * 4) =
                     *(undefined4 *)((long)local_138 + (node_left_2 & *local_138) * 8 + 0x80014);
              }
              goto LAB_001260e7;
            }
            if (local_140[cur_len_2 + local_1e0] < local_140[max_comp_len_2 + local_1e0]) {
              if (forest_2._4_4_ != 0) {
                *(uint *)(prev_ix_3 + node_right_2 * 4) = uVar1;
              }
              local_40 = local_138;
              local_48 = node_left_2;
              node_right_2 = (node_left_2 & *local_138) * 2 + 1;
              uVar1 = *(uint *)(prev_ix_3 + node_right_2 * 4);
              best_len_right_2 = local_1e0;
            }
            else {
              if (forest_2._4_4_ != 0) {
                *(uint *)(prev_ix_3 + best_len_left_2 * 4) = uVar1;
              }
              local_70 = local_138;
              local_78 = node_left_2;
              best_len_left_2 = (node_left_2 & *local_138) * 2;
              uVar1 = (uint)*(ulong *)(prev_ix_3 + (node_left_2 & *local_138) * 8);
              depth_remaining_2 = local_1e0;
            }
            backward_3 = backward_3 - 1;
          }
          if (forest_2._4_4_ != 0) {
            *(int *)(prev_ix_3 + node_right_2 * 4) = (int)local_138[0x10001];
            *(int *)(prev_ix_3 + best_len_left_2 * 4) = (int)local_138[0x10001];
          }
LAB_001260e7:
        }
        memset(local_1460 + orig_num_literals + 1,0,(uVar9 - 1) * 4);
        orig_num_literals = (uVar9 - 1) + orig_num_literals;
        sVar2 = i + 1;
      }
    }
    i = sVar2;
    orig_num_literals = orig_num_literals + 1;
  } while( true );
LAB_00124781:
  local_508 = local_508 + 1;
  limit2_1 = limit2_1 + 8;
  goto LAB_0012471f;
LAB_001254c6:
  local_2d8 = local_2d8 + 1;
  limit2_2 = limit2_2 + 8;
  goto LAB_00125464;
LAB_00125d22:
  local_e8 = local_e8 + 1;
  limit2_3 = limit2_3 + 8;
  goto LAB_00125cc0;
LAB_00124191:
  local_630 = local_630 + 1;
  limit2 = limit2 + 8;
  goto LAB_0012412f;
}

Assistant:

void BrotliCreateHqZopfliBackwardReferences(MemoryManager* m,
    size_t num_bytes, size_t position, const uint8_t* ringbuffer,
    size_t ringbuffer_mask, const BrotliEncoderParams* params,
    HasherHandle hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  uint32_t* num_matches = BROTLI_ALLOC(m, uint32_t, num_bytes);
  size_t matches_size = 4 * num_bytes;
  const size_t store_end = num_bytes >= StoreLookaheadH10() ?
      position + num_bytes - StoreLookaheadH10() + 1 : position;
  size_t cur_match_pos = 0;
  size_t i;
  size_t orig_num_literals;
  size_t orig_last_insert_len;
  int orig_dist_cache[4];
  size_t orig_num_commands;
  ZopfliCostModel model;
  ZopfliNode* nodes;
  BackwardMatch* matches = BROTLI_ALLOC(m, BackwardMatch, matches_size);
  size_t gap = 0;
  size_t shadow_matches = 0;
  if (BROTLI_IS_OOM(m)) return;
  for (i = 0; i + HashTypeLengthH10() - 1 < num_bytes; ++i) {
    const size_t pos = position + i;
    size_t max_distance = BROTLI_MIN(size_t, pos, max_backward_limit);
    size_t max_length = num_bytes - i;
    size_t num_found_matches;
    size_t cur_match_end;
    size_t j;
    /* Ensure that we have enough free slots. */
    BROTLI_ENSURE_CAPACITY(m, BackwardMatch, matches, matches_size,
        cur_match_pos + MAX_NUM_MATCHES_H10 + shadow_matches);
    if (BROTLI_IS_OOM(m)) return;
    num_found_matches = FindAllMatchesH10(hasher,
        &params->dictionary, ringbuffer, ringbuffer_mask, pos, max_length,
        max_distance, gap, params, &matches[cur_match_pos + shadow_matches]);
    cur_match_end = cur_match_pos + num_found_matches;
    for (j = cur_match_pos; j + 1 < cur_match_end; ++j) {
      BROTLI_DCHECK(BackwardMatchLength(&matches[j]) <=
          BackwardMatchLength(&matches[j + 1]));
    }
    num_matches[i] = (uint32_t)num_found_matches;
    if (num_found_matches > 0) {
      const size_t match_len = BackwardMatchLength(&matches[cur_match_end - 1]);
      if (match_len > MAX_ZOPFLI_LEN_QUALITY_11) {
        const size_t skip = match_len - 1;
        matches[cur_match_pos++] = matches[cur_match_end - 1];
        num_matches[i] = 1;
        /* Add the tail of the copy to the hasher. */
        StoreRangeH10(hasher, ringbuffer, ringbuffer_mask, pos + 1,
                      BROTLI_MIN(size_t, pos + match_len, store_end));
        memset(&num_matches[i + 1], 0, skip * sizeof(num_matches[0]));
        i += skip;
      } else {
        cur_match_pos = cur_match_end;
      }
    }
  }
  orig_num_literals = *num_literals;
  orig_last_insert_len = *last_insert_len;
  memcpy(orig_dist_cache, dist_cache, 4 * sizeof(dist_cache[0]));
  orig_num_commands = *num_commands;
  nodes = BROTLI_ALLOC(m, ZopfliNode, num_bytes + 1);
  if (BROTLI_IS_OOM(m)) return;
  InitZopfliCostModel(m, &model, &params->dist, num_bytes);
  if (BROTLI_IS_OOM(m)) return;
  for (i = 0; i < 2; i++) {
    BrotliInitZopfliNodes(nodes, num_bytes + 1);
    if (i == 0) {
      ZopfliCostModelSetFromLiteralCosts(
          &model, position, ringbuffer, ringbuffer_mask);
    } else {
      ZopfliCostModelSetFromCommands(&model, position, ringbuffer,
          ringbuffer_mask, commands, *num_commands - orig_num_commands,
          orig_last_insert_len);
    }
    *num_commands = orig_num_commands;
    *num_literals = orig_num_literals;
    *last_insert_len = orig_last_insert_len;
    memcpy(dist_cache, orig_dist_cache, 4 * sizeof(dist_cache[0]));
    *num_commands += ZopfliIterate(num_bytes, position, ringbuffer,
        ringbuffer_mask, params, max_backward_limit, gap, dist_cache,
        &model, num_matches, matches, nodes);
    BrotliZopfliCreateCommands(num_bytes, position, max_backward_limit,
        nodes, dist_cache, last_insert_len, params, commands, num_literals);
  }
  CleanupZopfliCostModel(m, &model);
  BROTLI_FREE(m, nodes);
  BROTLI_FREE(m, matches);
  BROTLI_FREE(m, num_matches);
}